

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.h
# Opt level: O0

HDWallet * __thiscall cfd::core::HDWallet::operator=(HDWallet *this,HDWallet *param_1)

{
  HDWallet *param_1_local;
  HDWallet *this_local;
  
  ByteData::operator=(&this->seed_,&param_1->seed_);
  return this;
}

Assistant:

class CFD_CORE_EXPORT HDWallet {
 public:
  /**
   * @brief seed byte size (128bit)
   */
  static constexpr uint32_t kSeed128Size = 16;
  /**
   * @brief seed byte size (256bit)
   */
  static constexpr uint32_t kSeed256Size = 32;
  /**
   * @brief seed byte size (512bit)
   */
  static constexpr uint32_t kSeed512Size = 64;

  /**
   * @brief constructor.
   */
  HDWallet();

  /**
   * @brief constructor.
   * @param[in] seed  seed
   */
  explicit HDWallet(const ByteData& seed);

  /**
   * @brief constructor.
   * @param[in] mnemonic                mnemonic
   * @param[in] passphrase              passphrase
   * @param[in] use_ideographic_space   ideographic space use flag. (default: false)
   */
  HDWallet(
      std::vector<std::string> mnemonic, std::string passphrase,
      bool use_ideographic_space = false);

  /**
   * @brief Get seed value.
   * @return seed
   */
  ByteData GetSeed() const;

  /**
   * @brief Generate an extended privkey.
   * @param[in] network_type      network type
   * @param[in] format_type       format type
   * @return extended privkey
   * @throws CfdException If invalid seed.
   */
  ExtPrivkey GeneratePrivkey(
      NetType network_type,
      Bip32FormatType format_type = Bip32FormatType::kNormal) const;
  /**
   * @brief Generate an extended privkey.
   * @param[in] network_type      network type
   * @param[in] child_num         child number
   * @param[in] format_type       format type
   * @return extended privkey
   * @throws CfdException If invalid seed.
   */
  ExtPrivkey GeneratePrivkey(
      NetType network_type, uint32_t child_num,
      Bip32FormatType format_type = Bip32FormatType::kNormal) const;
  /**
   * @brief Generate an extended privkey.
   * @param[in] network_type      network type
   * @param[in] path              child number path
   * @param[in] format_type       format type
   * @return extended privkey
   * @throws CfdException If invalid seed.
   */
  ExtPrivkey GeneratePrivkey(
      NetType network_type, const std::vector<uint32_t>& path,
      Bip32FormatType format_type = Bip32FormatType::kNormal) const;
  /**
   * @brief Generate an extended privkey.
   * @param[in] network_type      network type
   * @param[in] string_path       child number string path
   * @param[in] format_type       format type
   * @return extended privkey
   * @throws CfdException If invalid seed.
   */
  ExtPrivkey GeneratePrivkey(
      NetType network_type, const std::string& string_path,
      Bip32FormatType format_type = Bip32FormatType::kNormal) const;

  /**
   * @brief Generate an extended privkey data.
   * @param[in] network_type      network type
   * @param[in] path              child number path
   * @param[in] format_type       format type
   * @return extended privkey
   * @throws CfdException If invalid seed.
   */
  KeyData GeneratePrivkeyData(
      NetType network_type, const std::vector<uint32_t>& path,
      Bip32FormatType format_type = Bip32FormatType::kNormal) const;
  /**
   * @brief Generate an extended privkey data.
   * @param[in] network_type      network type
   * @param[in] string_path       child number string path
   * @param[in] format_type       format type
   * @return extended privkey
   * @throws CfdException If invalid seed.
   */
  KeyData GeneratePrivkeyData(
      NetType network_type, const std::string& string_path,
      Bip32FormatType format_type = Bip32FormatType::kNormal) const;

  /**
   * @brief Generate an extended pubkey.
   * @param[in] network_type      network type
   * @param[in] format_type       format type
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  ExtPubkey GeneratePubkey(
      NetType network_type,
      Bip32FormatType format_type = Bip32FormatType::kNormal) const;
  /**
   * @brief Generate an extended pubkey.
   * @param[in] network_type      network type
   * @param[in] child_num         child number
   * @param[in] format_type       format type
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  ExtPubkey GeneratePubkey(
      NetType network_type, uint32_t child_num,
      Bip32FormatType format_type = Bip32FormatType::kNormal) const;
  /**
   * @brief Generate an extended pubkey.
   * @param[in] network_type      network type
   * @param[in] path              child number path
   * @param[in] format_type       format type
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  ExtPubkey GeneratePubkey(
      NetType network_type, const std::vector<uint32_t>& path,
      Bip32FormatType format_type = Bip32FormatType::kNormal) const;
  /**
   * @brief Generate an extended pubkey.
   * @param[in] network_type      network type
   * @param[in] string_path       child number string path
   * @param[in] format_type       format type
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  ExtPubkey GeneratePubkey(
      NetType network_type, const std::string& string_path,
      Bip32FormatType format_type = Bip32FormatType::kNormal) const;

  /**
   * @brief Generate an extended pubkey data.
   * @param[in] network_type      network type
   * @param[in] path              child number path
   * @param[in] format_type       format type
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  KeyData GeneratePubkeyData(
      NetType network_type, const std::vector<uint32_t>& path,
      Bip32FormatType format_type = Bip32FormatType::kNormal) const;
  /**
   * @brief Generate an extended pubkey data.
   * @param[in] network_type      network type
   * @param[in] string_path       child number string path
   * @param[in] format_type       format type
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  KeyData GeneratePubkeyData(
      NetType network_type, const std::string& string_path,
      Bip32FormatType format_type = Bip32FormatType::kNormal) const;

  /**
   * @brief Get the Wordlist available in Mnemonic.
   * @param[in] language  language to Wordlist
   * @return Wordlist vector
   * @throws CfdException If invalid language passed.
   */
  static std::vector<std::string> GetMnemonicWordlist(
      const std::string& language);

  /**
   * @brief Get the Wordlist available in Mnemonic.
   * @param[in] entropy     Entropy value for Mnemonic generation
   * @param[in] language    language to mnemonic
   * @return mnemonic vector
   * @throws CfdException If invalid language passed.
   */
  static std::vector<std::string> ConvertEntropyToMnemonic(
      const ByteData& entropy, const std::string& language);

  /**
   * @brief Convert from Mnemonic to Entropy.
   * @param[in] mnemonic  mnemonic vector
   * @param[in] language  language to mnemonic
   * @return entropy data
   * @throws CfdException If invalid language passed.
   */
  static ByteData ConvertMnemonicToEntropy(
      const std::vector<std::string>& mnemonic, const std::string& language);

  /**
   * @brief Verify mnemonic is valid
   * @param[in] mnemonic                mnemonic vector to check valid
   * @param[in] language                language to verify
   * @retval true   mnemonic checksum is valid
   * @retval false  mnemonic checksum is invalid
   */
  static bool CheckValidMnemonic(
      const std::vector<std::string>& mnemonic, const std::string& language);

 private:
  ByteData seed_;  //!< seed

  /**
   * @brief Determine if the language is supported by Mnemonic.
   * @param[in] language  language used by mnemonic.
   * @retval true   If language is supported.
   * @retval false  If language is not supported.
   */
  static bool CheckSupportedLanguages(const std::string& language);

  /**
   * @brief Generate seed from mnemonic and passphrase.
   * @param[in] mnemonic                mnemonic vector
   * @param[in] passphrase              passphrase
   * @param[in] use_ideographic_space   Flag to separate with double-byte space
   * @return seed
   */
  static ByteData ConvertMnemonicToSeed(
      const std::vector<std::string>& mnemonic, const std::string& passphrase,
      bool use_ideographic_space = false);
}